

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmDivl<(moira::Instr)154,(moira::Mode)11,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  u32 uVar2;
  StrWriter *this_00;
  Dn dn;
  char *str_00;
  bool bVar3;
  Ea<(moira::Mode)11,_4> src;
  u32 local_48;
  ushort local_44;
  u32 local_40;
  Av<(moira::Instr)154,_(moira::Mode)11,_4> local_34;
  
  uVar1 = *addr;
  uVar2 = dasmIncRead<2>(this,addr);
  local_44 = op & 7;
  local_48 = *addr;
  local_40 = dasmIncRead<4>(this,addr);
  bVar3 = (str->style->syntax & ~MOIRA_MIT) == GNU;
  str_00 = ":";
  if (bVar3) {
    str_00 = ",";
  }
  if ((uVar2 & 0x83f8) != 0 && bVar3) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)154,(moira::Mode)11,4>(this,str,addr,op);
    return;
  }
  if ((uVar2 >> 0xb & 1) == 0) {
    StrWriter::operator<<();
  }
  else {
    StrWriter::operator<<(str);
  }
  dn.raw = uVar2 >> 0xc & 7;
  if ((uVar2 >> 10 & 1) == 0) {
    if ((dn.raw == (uVar2 & 7)) && (str->style->syntax == MUSASHI)) {
      this_00 = StrWriter::operator<<(str);
      StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
      StrWriter::operator<<(this_00,(Ea<(moira::Mode)11,_4> *)&local_48);
      StrWriter::operator<<(this_00);
      goto LAB_002a8008;
    }
    StrWriter::operator<<(str,"l");
  }
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  StrWriter::operator<<(this_00,(Ea<(moira::Mode)11,_4> *)&local_48);
  StrWriter::operator<<(this_00);
  StrWriter::operator<<(this_00,(Dn)(uVar2 & 7));
  StrWriter::operator<<(this_00,str_00);
LAB_002a8008:
  StrWriter::operator<<(this_00,dn);
  local_34.ext1 = 0;
  StrWriter::operator<<(str,&local_34);
  return;
}

Assistant:

void
Moira::dasmDivl(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dl  = Dn       ( _xxx____________(ext)      );
    auto dh  = Dn       ( _____________xxx(ext)      );

    auto fill = str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT ? "," : ":";

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            // Catch illegal extension words
            if (!isValidExt(I, M, op, ext)) {

                addr = old;
                dasmIllegal<I, M, S>(str, addr, op);
                return;
            }
            [[fallthrough]];

        default:

            (ext & 1 << 11) ? str << Ins<Instr::DIVS>{} : str << Ins<Instr::DIVU>{};

            if (ext & 1 << 10) {

                // DIVS.L <ea>,Dr:Dq    (64-bit dividend)
                str << Sz<S>{} << str.tab << src << Sep{} << dh << fill << dl;

            } else {

                // DIVSL.L <ea>,Dr:Dq   (32-bit dividend)
                if (dl.raw == dh.raw && str.style.syntax == Syntax::MUSASHI) {
                    str << Sz<S>{} << str.tab << src << Sep{} << dh;
                } else {
                    str << "l" << Sz<S>{} << str.tab << src << Sep{} << dh << fill << dl;

                }
            }
            str << Av<I, M, S>{};
    }
}